

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

void __thiscall duckdb_re2::Prog::Prog(Prog *this)

{
  undefined1 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined4 *)(in_RDI + 0xc) = 0;
  *(undefined4 *)(in_RDI + 0x10) = 0;
  *(undefined4 *)(in_RDI + 0x14) = 0;
  in_RDI[0x18] = 0;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined4 *)(in_RDI + 0x30) = 0;
  PODArray<unsigned_short>::PODArray((PODArray<unsigned_short> *)0x8446e3);
  *(undefined8 *)(in_RDI + 0x68) = 0;
  PODArray<duckdb_re2::Prog::Inst>::PODArray((PODArray<duckdb_re2::Prog::Inst> *)0x8446fe);
  PODArray<unsigned_char>::PODArray((PODArray<unsigned_char> *)0x84470e);
  *(undefined8 *)(in_RDI + 0x90) = 0;
  *(undefined8 *)(in_RDI + 0x98) = 0;
  *(undefined8 *)(in_RDI + 0xa0) = 0;
  std::once_flag::once_flag((once_flag *)(in_RDI + 0x1a8));
  std::once_flag::once_flag((once_flag *)(in_RDI + 0x1ac));
  return;
}

Assistant:

Prog::Prog()
  : anchor_start_(false),
    anchor_end_(false),
    reversed_(false),
    did_flatten_(false),
    did_onepass_(false),
    start_(0),
    start_unanchored_(0),
    size_(0),
    bytemap_range_(0),
    prefix_foldcase_(false),
    prefix_size_(0),
    list_count_(0),
    bit_state_text_max_size_(0),
    dfa_mem_(0),
    dfa_first_(NULL),
    dfa_longest_(NULL) {
}